

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int patternCompare(u8 *zPattern,u8 *zString,int esc,int noCase)

{
  bool bVar1;
  u8 *zPattern_00;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  u8 *local_50;
  u8 *local_48;
  int local_3c;
  uint local_38;
  uint local_34;
  
  if (zString == (u8 *)0x0 || zPattern == (u8 *)0x0) {
    return 0;
  }
  bVar1 = false;
  local_50 = zString;
  local_48 = zPattern;
  local_3c = noCase;
  uVar3 = jx9Utf8Read(zPattern,(uchar *)0x0,&local_48);
  if (uVar3 != 0) {
    local_38 = esc;
    do {
      if (uVar3 == 0x2a && !bVar1) {
        while( true ) {
          do {
            uVar3 = jx9Utf8Read(local_48,(uchar *)0x0,&local_48);
          } while (uVar3 == 0x2a);
          if (uVar3 != 0x3f) break;
          iVar4 = jx9Utf8Read(local_50,(uchar *)0x0,&local_50);
          if (iVar4 == 0) {
            return 0;
          }
        }
        if (uVar3 != 0) {
          if (uVar3 == esc) {
            uVar3 = jx9Utf8Read(local_48,(uchar *)0x0,&local_48);
            if (uVar3 == 0) {
              return 0;
            }
          }
          else if (uVar3 == 0x5b) {
            return 0;
          }
          iVar4 = local_3c;
          zPattern_00 = local_48;
          do {
            uVar6 = jx9Utf8Read(local_50,(uchar *)0x0,&local_50);
            if (uVar6 == 0) {
              return 0;
            }
            if (iVar4 == 0) {
              uVar2 = 1;
              uVar7 = uVar6;
              do {
                uVar6 = uVar2;
                if (uVar7 == uVar3) break;
                uVar6 = jx9Utf8Read(local_50,(uchar *)0x0,&local_50);
                uVar2 = uVar6;
                uVar7 = uVar6;
              } while (uVar6 != 0);
            }
            else {
              if ((int)uVar6 < 0x80) {
                uVar6 = (uint)""[(int)uVar6];
              }
              if ((int)uVar3 < 0x80) {
                uVar3 = (uint)""[(int)uVar3];
              }
              while ((uVar6 != 0 && (uVar6 != uVar3))) {
                uVar6 = jx9Utf8Read(local_50,(uchar *)0x0,&local_50);
                if ((int)uVar6 < 0x80) {
                  uVar6 = (uint)""[(int)uVar6];
                }
              }
            }
            if (uVar6 == 0) {
              return 0;
            }
            iVar5 = patternCompare(zPattern_00,local_50,esc,iVar4);
          } while (iVar5 == 0);
        }
        return 1;
      }
      if (uVar3 != 0x3f || bVar1) {
        if (uVar3 == 0x5b) {
          if (esc == 0) {
            return 0;
          }
          iVar4 = jx9Utf8Read(local_50,(uchar *)0x0,&local_50);
          if (iVar4 == 0) {
            return 0;
          }
          uVar3 = 0;
          iVar5 = jx9Utf8Read(local_48,(uchar *)0x0,&local_48);
          bVar9 = iVar5 == 0x5e;
          if (bVar9) {
            iVar5 = jx9Utf8Read(local_48,(uchar *)0x0,&local_48);
          }
          local_34 = (uint)bVar9;
          iVar8 = 0;
          if (iVar5 != 0x5d) goto LAB_001405fe;
          iVar8 = 0;
          uVar6 = (uint)(iVar4 == 0x5d);
          while( true ) {
            while( true ) {
              uVar3 = uVar6;
              iVar5 = jx9Utf8Read(local_48,(uchar *)0x0,&local_48);
LAB_001405fe:
              if (iVar5 != 0x2d) break;
              if ((*local_48 == ']') || (iVar8 < 1 || *local_48 == '\0')) goto LAB_0014068b;
              iVar5 = jx9Utf8Read(local_48,(uchar *)0x0,&local_48);
              uVar6 = 1;
              if (iVar5 < iVar4) {
                uVar6 = uVar3;
              }
              bVar9 = iVar4 < iVar8;
              iVar8 = 0;
              if (bVar9) {
                uVar6 = uVar3;
              }
            }
            if (iVar5 == 0x5d) break;
            if (iVar5 == 0) {
              return 0;
            }
LAB_0014068b:
            iVar8 = iVar5;
            uVar6 = uVar3;
            if (iVar4 == iVar5) {
              uVar6 = 1;
            }
          }
          esc = local_38;
          if (uVar3 == local_34) {
            return 0;
          }
        }
        else {
          bVar9 = bVar1 || uVar3 != esc;
          bVar1 = true;
          if (bVar9) {
            uVar6 = jx9Utf8Read(local_50,(uchar *)0x0,&local_50);
            if (local_3c != 0) {
              if ((int)uVar3 < 0x80) {
                uVar3 = (uint)""[(int)uVar3];
              }
              if ((int)uVar6 < 0x80) {
                uVar6 = (uint)""[(int)uVar6];
              }
            }
            bVar1 = false;
            if (uVar3 != uVar6) {
              return 0;
            }
          }
        }
      }
      else {
        bVar1 = false;
        iVar4 = jx9Utf8Read(local_50,(uchar *)0x0,&local_50);
        if (iVar4 == 0) {
          return 0;
        }
      }
      uVar3 = jx9Utf8Read(local_48,(uchar *)0x0,&local_48);
    } while (uVar3 != 0);
  }
  return (uint)(*local_50 == '\0');
}

Assistant:

static int patternCompare(
  const u8 *zPattern,              /* The glob pattern */
  const u8 *zString,               /* The string to compare against the glob */
  const int esc,                    /* The escape character */
  int noCase
){
  int c, c2;
  int invert;
  int seen;
  u8 matchOne = '?';
  u8 matchAll = '*';
  u8 matchSet = '[';
  int prevEscape = 0;     /* True if the previous character was 'escape' */

  if( !zPattern || !zString ) return 0;
  while( (c = jx9Utf8Read(zPattern, 0, &zPattern))!=0 ){
    if( !prevEscape && c==matchAll ){
      while( (c= jx9Utf8Read(zPattern, 0, &zPattern)) == matchAll
               || c == matchOne ){
        if( c==matchOne && jx9Utf8Read(zString, 0, &zString)==0 ){
          return 0;
        }
      }
      if( c==0 ){
        return 1;
      }else if( c==esc ){
        c = jx9Utf8Read(zPattern, 0, &zPattern);
        if( c==0 ){
          return 0;
        }
      }else if( c==matchSet ){
	  if( (esc==0) || (matchSet<0x80) ) return 0;
	  while( *zString && patternCompare(&zPattern[-1], zString, esc, noCase)==0 ){
          SQLITE_SKIP_UTF8(zString);
        }
        return *zString!=0;
      }
      while( (c2 = jx9Utf8Read(zString, 0, &zString))!=0 ){
        if( noCase ){
          GlogUpperToLower(c2);
          GlogUpperToLower(c);
          while( c2 != 0 && c2 != c ){
            c2 = jx9Utf8Read(zString, 0, &zString);
            GlogUpperToLower(c2);
          }
        }else{
          while( c2 != 0 && c2 != c ){
            c2 = jx9Utf8Read(zString, 0, &zString);
          }
        }
        if( c2==0 ) return 0;
		if( patternCompare(zPattern, zString, esc, noCase) ) return 1;
      }
      return 0;
    }else if( !prevEscape && c==matchOne ){
      if( jx9Utf8Read(zString, 0, &zString)==0 ){
        return 0;
      }
    }else if( c==matchSet ){
      int prior_c = 0;
      if( esc == 0 ) return 0;
      seen = 0;
      invert = 0;
      c = jx9Utf8Read(zString, 0, &zString);
      if( c==0 ) return 0;
      c2 = jx9Utf8Read(zPattern, 0, &zPattern);
      if( c2=='^' ){
        invert = 1;
        c2 = jx9Utf8Read(zPattern, 0, &zPattern);
      }
      if( c2==']' ){
        if( c==']' ) seen = 1;
        c2 = jx9Utf8Read(zPattern, 0, &zPattern);
      }
      while( c2 && c2!=']' ){
        if( c2=='-' && zPattern[0]!=']' && zPattern[0]!=0 && prior_c>0 ){
          c2 = jx9Utf8Read(zPattern, 0, &zPattern);
          if( c>=prior_c && c<=c2 ) seen = 1;
          prior_c = 0;
        }else{
          if( c==c2 ){
            seen = 1;
          }
          prior_c = c2;
        }
        c2 = jx9Utf8Read(zPattern, 0, &zPattern);
      }
      if( c2==0 || (seen ^ invert)==0 ){
        return 0;
      }
    }else if( esc==c && !prevEscape ){
      prevEscape = 1;
    }else{
      c2 = jx9Utf8Read(zString, 0, &zString);
      if( noCase ){
        GlogUpperToLower(c);
        GlogUpperToLower(c2);
      }
      if( c!=c2 ){
        return 0;
      }
      prevEscape = 0;
    }
  }
  return *zString==0;
}